

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

void __thiscall
QGraphicsAnchorLayoutPrivate::calculateGraphs
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  const_iterator begin;
  bool bVar1;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath> *this_00;
  long lVar2;
  long in_FS_OFFSET;
  AnchorVertex *v;
  QList<QtGraphicsAnchorLayout::AnchorData_*> local_c8;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath> local_a8;
  AnchorVertex *local_90;
  QList<QtGraphicsAnchorLayout::AnchorData_*> local_88;
  GraphParts local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (calculateGraphs(Qt::Orientation)::simplificationEnabled == '\0') {
    calculateGraphs();
  }
  refreshAllSizeHints(this,orientation);
  if (calculateGraphs::simplificationEnabled == true) {
    bVar1 = simplifyGraph(this,orientation);
    if (!bVar1) {
      calculateGraphs();
      goto LAB_005cd99a;
    }
  }
  findPaths(this,orientation);
  constraintsFromPaths(this,orientation);
  local_68.trunkConstraints.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.trunkConstraints.d.ptr = (QSimplexConstraint **)&DAT_aaaaaaaaaaaaaaaa;
  local_68.trunkConstraints.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.nonTrunkConstraints.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.nonTrunkConstraints.d.ptr = (QSimplexConstraint **)&DAT_aaaaaaaaaaaaaaaa;
  local_68.nonTrunkConstraints.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  getGraphParts(&local_68,this,orientation);
  local_88.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_88.d.ptr = (AnchorData **)&DAT_aaaaaaaaaaaaaaaa;
  getVariables(&local_88,&local_68.trunkConstraints);
  lVar2 = (long)(int)orientation;
  local_90 = (this->layoutCentralVertex).m_data[lVar2 + 1];
  this_00 = (this->graphPaths).m_data + lVar2 + -1;
  local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::value
            (&local_a8,(AnchorVertex **)this_00);
  bVar1 = calculateTrunk(this,orientation,(GraphPath *)&local_a8,&local_68.trunkConstraints,
                         &local_88);
  if ((bVar1) && ((undefined1 *)local_68.nonTrunkConstraints.d.size != (undefined1 *)0x0)) {
    local_c8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.d.ptr = (AnchorData **)&DAT_aaaaaaaaaaaaaaaa;
    getVariables(&local_c8,&local_68.nonTrunkConstraints);
    bVar1 = calculateNonTrunk(this,&local_68.nonTrunkConstraints,&local_c8);
    if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  updateAnchorSizes(this,orientation);
  *(byte *)((long)(this->interpolationProgress).m_data + lVar2 + 0xf) = bVar1 ^ 1;
  begin.i = (this->constraints).m_data[lVar2 + -1].d.ptr;
  qDeleteAll<QList<QSimplexConstraint*>::const_iterator>
            (begin,(const_iterator)(begin.i + (this->constraints).m_data[lVar2 + -1].d.size));
  QList<QSimplexConstraint_*>::clear((this->constraints).m_data + lVar2 + -1);
  QMultiHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::GraphPath>::clear
            (this_00);
  if (calculateGraphs::simplificationEnabled == true) {
    restoreSimplifiedGraph(this,orientation);
  }
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash
            ((QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *)&local_a8.m_size);
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::~QHash
            ((QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *)&local_a8);
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (&(local_68.nonTrunkConstraints.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.nonTrunkConstraints.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
    _M_i = ((local_68.nonTrunkConstraints.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.nonTrunkConstraints.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.nonTrunkConstraints.d.d)->super_QArrayData,8,0x10);
    }
  }
  if (&(local_68.trunkConstraints.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.trunkConstraints.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((local_68.trunkConstraints.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.trunkConstraints.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(local_68.trunkConstraints.d.d)->super_QArrayData,8,0x10);
    }
  }
LAB_005cd99a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::calculateGraphs(Qt::Orientation orientation)
{
#if defined(QT_DEBUG) || defined(QT_BUILD_INTERNAL)
    lastCalculationUsedSimplex[orientation] = false;
#endif

    static bool simplificationEnabled = qEnvironmentVariableIsEmpty("QT_ANCHORLAYOUT_NO_SIMPLIFICATION");

    // Reset the nominal sizes of each anchor based on the current item sizes
    refreshAllSizeHints(orientation);

    // Simplify the graph
    if (simplificationEnabled && !simplifyGraph(orientation)) {
        qWarning("QGraphicsAnchorLayout: anchor setup is not feasible.");
        graphHasConflicts[orientation] = true;
        return;
    }

    // Traverse all graph edges and store the possible paths to each vertex
    findPaths(orientation);

    // From the paths calculated above, extract the constraints that the current
    // anchor setup impose, to our Linear Programming problem.
    constraintsFromPaths(orientation);

    // Split the constraints and anchors into groups that should be fed to the
    // simplex solver independently. Currently we find two groups:
    //
    //  1) The "trunk", that is, the set of anchors (items) that are connected
    //     to the two opposite sides of our layout, and thus need to stretch in
    //     order to fit in the current layout size.
    //
    //  2) The floating or semi-floating anchors (items) that are those which
    //     are connected to only one (or none) of the layout sides, thus are not
    //     influenced by the layout size.
    const auto parts = getGraphParts(orientation);

    // Now run the simplex solver to calculate Minimum, Preferred and Maximum sizes
    // of the "trunk" set of constraints and variables.
    // ### does trunk always exist? empty = trunk is the layout left->center->right
    const QList<AnchorData *> trunkVariables = getVariables(parts.trunkConstraints);

    // For minimum and maximum, use the path between the two layout sides as the
    // objective function.
    AnchorVertex *v = layoutLastVertex[orientation];
    GraphPath trunkPath = graphPaths[orientation].value(v);

    bool feasible = calculateTrunk(orientation, trunkPath, parts.trunkConstraints, trunkVariables);

    // For the other parts that not the trunk, solve only for the preferred size
    // that is the size they will remain at, since they are not stretched by the
    // layout.

    if (feasible && !parts.nonTrunkConstraints.isEmpty()) {
        const QList<AnchorData *> partVariables = getVariables(parts.nonTrunkConstraints);
        Q_ASSERT(!partVariables.isEmpty());
        feasible = calculateNonTrunk(parts.nonTrunkConstraints, partVariables);
    }

    // Propagate the new sizes down the simplified graph, ie. tell the
    // group anchors to set their children anchors sizes.
    updateAnchorSizes(orientation);

    graphHasConflicts[orientation] = !feasible;

    // Clean up our data structures. They are not needed anymore since
    // distribution uses just interpolation.
    qDeleteAll(constraints[orientation]);
    constraints[orientation].clear();
    graphPaths[orientation].clear(); // ###

    if (simplificationEnabled)
        restoreSimplifiedGraph(orientation);
}